

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O1

int remove_periodic_task(select_data_ptr sd,periodic_task_handle_conflict handle)

{
  pthread_t pVar1;
  periodic_task_handle_conflict p_Var2;
  pthread_t pVar3;
  periodic_task_handle_conflict p_Var4;
  periodic_task_handle *pp_Var5;
  
  p_Var2 = sd->periodic_task_list;
  if (p_Var2 == handle) {
    p_Var4 = (periodic_task_handle_conflict)0x0;
  }
  else {
    do {
      p_Var4 = p_Var2;
      p_Var2 = p_Var4->next;
      if (p_Var2 == (periodic_task_handle)0x0) {
        return 0;
      }
    } while (p_Var2 != handle);
  }
  pp_Var5 = &p_Var4->next;
  if (p_Var4 == (periodic_task_handle_conflict)0x0) {
    pp_Var5 = &sd->periodic_task_list;
  }
  *pp_Var5 = p_Var2->next;
  pVar1 = handle->executing;
  pVar3 = pthread_self();
  if (pVar1 != pVar3) {
    while (handle->executing != 0xffffffffffffffff) {
      sched_yield();
    }
  }
  free(handle);
  sd->select_consistency_number = sd->select_consistency_number + 1;
  return 1;
}

Assistant:

static int
remove_periodic_task(select_data_ptr sd, periodic_task_handle handle)
{
    periodic_task_handle list, last = NULL;
    list = sd->periodic_task_list;
    
    while(list != handle) {
	last = list;
	list = list->next;
	if (list == NULL) {
	    return 0;
	}
    }
    /* unlink task */
    if (last == NULL) {
	sd->periodic_task_list = list->next;
    } else {
	last->next = list->next;
    }
    if (handle->executing != thr_thread_self()) {
	/* someone besides us executing this ? */
        int i = 0;
	while (handle->executing != (thr_thread_t)-1) {
	    /* wait until they're done */
	    thr_thread_yield();
	    i++;
	    if (i > 1000) {
	        /* give up */
	        continue;
	    }
	}
    }
    free(handle);
    sd->select_consistency_number++;
    return 1;
}